

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

int logging_set_level(char *filename,int level)

{
  Node *pNVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  int iVar5;
  
  iVar2 = strcmp("all",filename);
  pNVar1 = file_data_list->mTail;
  pNVar4 = file_data_list->mHead->next;
  iVar5 = 0;
  do {
    if (pNVar4 == pNVar1) {
      return iVar5;
    }
    if (iVar2 == 0) {
LAB_00122cf7:
      *(pNVar4->val).level = level;
      iVar5 = 1;
    }
    else {
      iVar3 = strcmp((pNVar4->val).filename,filename);
      if (iVar3 == 0) goto LAB_00122cf7;
    }
    pNVar4 = pNVar4->next;
  } while( true );
}

Assistant:

int logging_set_level( const char *filename, int level )
{
	int all_files = ( strcmp( "all", filename ) == 0 );
	int result = 0;
	
	TRACE_BEGIN(LOG_LVL_INFO);
	LOG( "changing logging properties on file %s\n", filename );

	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		if ( all_files == 1 || strcmp(i->filename, filename) == 0 )
		{
			*(i->level) = level;
			result = 1;
		}
	}

	// Seems like everything came out OK
	TRACE_END();
	return result;
}